

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

void __thiscall QScrollAreaPrivate::updateScrollBars(QScrollAreaPrivate *this)

{
  int iVar1;
  int iVar2;
  Data *pDVar3;
  QWidgetData *pQVar4;
  QObject *pQVar5;
  long lVar6;
  byte bVar7;
  Representation RVar8;
  int iVar9;
  QSizePolicy QVar10;
  Representation RVar11;
  uint uVar12;
  int iVar13;
  QSize QVar14;
  QSize QVar15;
  QSize QVar16;
  QLayout *pQVar17;
  Representation RVar18;
  Representation RVar19;
  Representation step;
  QWidget *pQVar20;
  Representation RVar21;
  ulong uVar22;
  Representation RVar23;
  ulong uVar24;
  Representation RVar25;
  Representation RVar26;
  ulong uVar27;
  Representation step_00;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->widget).wp.d;
  if (((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
     ((this->widget).wp.value == (QObject *)0x0)) goto LAB_0047a40e;
  pQVar4 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar9 = (pQVar4->crect).x2.m_i;
  iVar13 = (pQVar4->crect).y2.m_i;
  iVar1 = (pQVar4->crect).x1.m_i;
  iVar2 = (pQVar4->crect).y1.m_i;
  QVar14 = QAbstractScrollArea::maximumViewportSize
                     (*(QAbstractScrollArea **)
                       &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8);
  pDVar3 = (this->widget).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar20 = (QWidget *)0x0;
  }
  else {
    pQVar20 = (QWidget *)(this->widget).wp.value;
  }
  QVar15 = qSmartMinSize(pQVar20);
  RVar26 = QVar15.ht.m_i;
  pDVar3 = (this->widget).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar20 = (QWidget *)0x0;
  }
  else {
    pQVar20 = (QWidget *)(this->widget).wp.value;
  }
  step_00.m_i = (iVar9 - iVar1) + 1;
  step.m_i = (iVar13 - iVar2) + 1;
  QVar16 = qSmartMaxSize(pQVar20,(Alignment)0x0);
  uVar22 = (ulong)QVar16 >> 0x20;
  RVar25 = QVar15.wd.m_i;
  RVar18 = QVar14.wd.m_i;
  RVar8 = QVar14.ht.m_i;
  RVar23.m_i = RVar25.m_i;
  if (this->resizable == true) {
    pQVar17 = QWidget::layout((QWidget *)(this->widget).wp.value);
    pQVar20 = (QWidget *)(this->widget).wp.value;
    if (pQVar17 == (QLayout *)0x0) {
      QVar10 = QWidget::sizePolicy(pQVar20);
      bVar7 = QVar10.field_0._3_1_ >> 5 & 1;
    }
    else {
      pQVar17 = QWidget::layout(pQVar20);
      iVar9 = (*(pQVar17->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar17->super_QLayoutItem);
      bVar7 = (byte)iVar9;
    }
    if (bVar7 != 0) {
      if (RVar25.m_i < step_00.m_i) {
        RVar23.m_i = step_00.m_i;
      }
      RVar19.m_i = RVar26.m_i;
      if (RVar26.m_i < step.m_i) {
        RVar19.m_i = step.m_i;
      }
      RVar11 = QVar16.wd.m_i;
      uVar24 = (ulong)(uint)RVar23.m_i;
      if (RVar11.m_i <= RVar23.m_i) {
        uVar24 = (ulong)QVar16 & 0xffffffff;
      }
      RVar23.m_i = (int)uVar24;
      RVar21 = QVar16.ht.m_i;
      if (RVar21.m_i <= RVar19.m_i) {
        RVar19.m_i = RVar21.m_i;
      }
      pQVar5 = (this->widget).wp.value;
      uVar12 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,uVar24);
      uVar24 = (ulong)uVar12;
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded) {
        iVar9 = (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).vbar)->
                                       super_QAbstractSlider).super_QWidget + 0x70))();
        if (RVar25.m_i < RVar18.m_i) {
          QVar15 = QVar14;
        }
        if (RVar26.m_i < RVar8.m_i) {
          RVar26.m_i = RVar8.m_i;
        }
        RVar25.m_i = QVar15.wd.m_i.m_i;
        if (RVar11.m_i <= QVar15.wd.m_i.m_i) {
          RVar25.m_i = RVar11.m_i;
        }
        if (RVar21.m_i <= RVar26.m_i) {
          RVar26.m_i = RVar21.m_i;
        }
        pQVar5 = (this->widget).wp.value;
        iVar13 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,RVar25.m_i - iVar9);
        if (iVar13 <= RVar8.m_i) {
          for (; (RVar8.m_i < (int)uVar12 && (iVar9 != 0)); iVar9 = iVar9 + -1) {
            RVar25.m_i = RVar25.m_i - 1;
            pQVar5 = (this->widget).wp.value;
            uVar12 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,RVar25.m_i);
            uVar24 = (ulong)uVar12;
          }
        }
        uVar12 = (uint)uVar24;
        uVar22 = (ulong)(uint)RVar26.m_i;
        if (RVar26.m_i <= (int)uVar12) {
          uVar22 = uVar24;
        }
        QVar16.ht.m_i = 0;
        QVar16.wd.m_i = RVar25.m_i;
      }
      RVar26.m_i = uVar12;
      if ((int)uVar12 < RVar19.m_i) {
        RVar26.m_i = RVar19.m_i;
      }
    }
  }
  if (this->resizable == true) {
    if ((RVar23.m_i <= RVar18.m_i) &&
       (((RVar26.m_i <= RVar8.m_i && (RVar18.m_i <= QVar16.wd.m_i.m_i)) &&
        (RVar8.m_i <= (int)uVar22)))) {
LAB_0047a347:
      step_00.m_i = RVar18.m_i;
      step.m_i = RVar8.m_i;
    }
  }
  else {
    lVar6 = *(long *)((this->widget).wp.value + 0x20);
    if (((*(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14)) + 1 <= RVar18.m_i) &&
       ((*(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18)) + 1 <= RVar8.m_i)) goto LAB_0047a347;
  }
  if (this->resizable != false) {
    if (RVar23.m_i < step_00.m_i) {
      RVar23.m_i = step_00.m_i;
    }
    if (RVar26.m_i < step.m_i) {
      RVar26.m_i = step.m_i;
    }
    uVar24 = (ulong)(uint)RVar23.m_i;
    if (QVar16.wd.m_i.m_i <= RVar23.m_i) {
      uVar24 = (ulong)QVar16 & 0xffffffff;
    }
    uVar27 = (ulong)(uint)RVar26.m_i;
    if ((int)uVar22 <= RVar26.m_i) {
      uVar27 = uVar22;
    }
    local_40 = (QSize)(uVar24 | uVar27 << 0x20);
    QWidget::resize((QWidget *)(this->widget).wp.value,&local_40);
  }
  lVar6 = *(long *)((this->widget).wp.value + 0x20);
  iVar9 = *(int *)(lVar6 + 0x20);
  iVar13 = *(int *)(lVar6 + 0x18);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,
             (*(int *)(lVar6 + 0x1c) - (*(int *)(lVar6 + 0x14) + step_00.m_i)) + 1);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step_00.m_i);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,
             (iVar9 - (iVar13 + step.m_i)) + 1);
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,step.m_i);
  updateWidgetPosition(this);
LAB_0047a40e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollAreaPrivate::updateScrollBars()
{
    Q_Q(QScrollArea);
    if (!widget)
        return;
    QSize p = viewport->size();
    QSize m = q->maximumViewportSize();

    QSize min = qSmartMinSize(widget);
    QSize max = qSmartMaxSize(widget);

    if (resizable) {
        if ((widget->layout() ? widget->layout()->hasHeightForWidth() : widget->sizePolicy().hasHeightForWidth())) {
            QSize p_hfw = p.expandedTo(min).boundedTo(max);
            int h = widget->heightForWidth(p_hfw.width());
            // If the height we calculated requires a vertical scrollbar,
            // then we need to constrain the width and calculate the height again,
            // otherwise we end up flipping the scrollbar on and off all the time.
            if (vbarpolicy == Qt::ScrollBarAsNeeded) {
                int vbarWidth = vbar->sizeHint().width();
                QSize m_hfw = m.expandedTo(min).boundedTo(max);
                // is there any point in searching?
                if (widget->heightForWidth(m_hfw.width() - vbarWidth) <= m.height()) {
                    while (h > m.height() && vbarWidth) {
                        --vbarWidth;
                        --m_hfw.rwidth();
                        h = widget->heightForWidth(m_hfw.width());
                    }
                }
                max = QSize(m_hfw.width(), qMax(m_hfw.height(), h));
            }
            min = QSize(p_hfw.width(), qMax(p_hfw.height(), h));
        }
    }

    if ((resizable && m.expandedTo(min) == m && m.boundedTo(max) == m)
        || (!resizable && m.expandedTo(widget->size()) == m))
        p = m; // no scroll bars needed

    if (resizable)
        widget->resize(p.expandedTo(min).boundedTo(max));
    QSize v = widget->size();

    hbar->setRange(0, v.width() - p.width());
    hbar->setPageStep(p.width());
    vbar->setRange(0, v.height() - p.height());
    vbar->setPageStep(p.height());
    updateWidgetPosition();

}